

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

void __thiscall
duckdb::DBConfig::RegisterArrowExtension(DBConfig *this,ArrowTypeExtension *extension)

{
  undefined1 *puVar1;
  get_type_t p_Var2;
  TypeInfo *pTVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  pthread_mutex_t *__mutex;
  pointer pAVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ArrowTypeExtensionData *this_00;
  vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_> *pvVar9;
  NotImplementedException *this_01;
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  *this_02;
  TypeInfo type_info;
  TypeInfo type_info_1;
  ArrowExtensionMetadata extension_info;
  TypeInfo TStack_198;
  string local_170;
  ArrowExtensionMetadata local_150;
  string local_d0;
  ArrowExtensionMetadata local_b0;
  
  this_02 = &this->arrow_extensions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(this_02);
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  ArrowExtensionMetadata::ArrowExtensionMetadata(&local_b0,&extension->extension_metadata);
  pAVar6 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
           ::operator->(this_02);
  iVar7 = ::std::
          _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(pAVar6->type_extensions)._M_h,&local_b0);
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  ::operator->(this_02);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
      ._M_cur == (__node_type *)0x0) {
    pAVar6 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(this_02);
    pmVar8 = ::std::__detail::
             _Map_base<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&pAVar6->type_extensions,&local_b0);
    p_Var2 = extension->get_type;
    pmVar8->populate_arrow_schema = extension->populate_arrow_schema;
    pmVar8->get_type = p_Var2;
    ::std::__cxx11::string::_M_assign((string *)&pmVar8->extension_metadata);
    ::std::__cxx11::string::_M_assign((string *)&(pmVar8->extension_metadata).vendor_name);
    ::std::__cxx11::string::_M_assign((string *)&(pmVar8->extension_metadata).type_name);
    ::std::__cxx11::string::_M_assign((string *)&(pmVar8->extension_metadata).arrow_format);
    shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator=
              (&pmVar8->type_extension,&extension->type_extension);
    if ((extension->type_extension).internal.
        super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      ArrowExtensionMetadata::ArrowExtensionMetadata(&local_150,&extension->extension_metadata);
      local_170._M_dataplus._M_p = (pointer)((long)&local_170 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_150.extension_name._M_dataplus._M_p,
                 local_150.extension_name._M_dataplus._M_p +
                 local_150.extension_name._M_string_length);
      TypeInfo::TypeInfo(&TStack_198,&local_170);
      if (local_170._M_dataplus._M_p != (pointer)((long)&local_170 + 0x10)) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if (local_150.arrow_format._M_dataplus._M_p != (pointer)((long)&local_150 + 0x70)) {
        operator_delete(local_150.arrow_format._M_dataplus._M_p);
      }
      if (local_150.type_name._M_dataplus._M_p != (pointer)((long)&local_150 + 0x50)) {
        operator_delete(local_150.type_name._M_dataplus._M_p);
      }
      if (local_150.vendor_name._M_dataplus._M_p != (pointer)((long)&local_150 + 0x30)) {
        operator_delete(local_150.vendor_name._M_dataplus._M_p);
      }
      if (local_150.extension_name._M_dataplus._M_p != (pointer)((long)&local_150 + 0x10)) {
        operator_delete(local_150.extension_name._M_dataplus._M_p);
      }
      pAVar6 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_02);
      pvVar9 = &::std::__detail::
                _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pAVar6->type_to_info,&TStack_198)->
                super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ;
      ::std::vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ::push_back(pvVar9,&local_b0);
      pTVar3 = &TStack_198;
    }
    else {
      this_00 = shared_ptr<duckdb::ArrowTypeExtensionData,_true>::operator->
                          (&extension->type_extension);
      ArrowTypeExtensionData::GetDuckDBType((LogicalType *)&TStack_198,this_00);
      TypeInfo::TypeInfo((TypeInfo *)&local_150,(LogicalType *)&TStack_198);
      LogicalType::~LogicalType((LogicalType *)&TStack_198);
      pAVar6 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
               ::operator->(this_02);
      pvVar9 = &::std::__detail::
                _Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<duckdb::TypeInfo,_std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>,_std::allocator<std::pair<const_duckdb::TypeInfo,_duckdb::vector<duckdb::ArrowExtensionMetadata,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TypeInfo>,_duckdb::HashTypeInfo,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pAVar6->type_to_info,(key_type *)&local_150)->
                super_vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ;
      ::std::vector<duckdb::ArrowExtensionMetadata,_std::allocator<duckdb::ArrowExtensionMetadata>_>
      ::push_back(pvVar9,&local_b0);
      pTVar3 = (TypeInfo *)&local_150;
    }
    paVar4 = &(pTVar3->alias).field_2;
    puVar1 = *(undefined1 **)(paVar4->_M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != paVar4) {
      operator_delete(puVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.arrow_format._M_dataplus._M_p != &local_b0.arrow_format.field_2) {
      operator_delete(local_b0.arrow_format._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.type_name._M_dataplus._M_p != &local_b0.type_name.field_2) {
      operator_delete(local_b0.type_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.vendor_name._M_dataplus._M_p != &local_b0.vendor_name.field_2) {
      operator_delete(local_b0.vendor_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.extension_name._M_dataplus._M_p != &local_b0.extension_name.field_2) {
      operator_delete(local_b0.extension_name._M_dataplus._M_p);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_150.extension_name._M_dataplus._M_p = (pointer)((long)&local_150 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"Arrow Extension with configuration %s is already registered","");
  ArrowExtensionMetadata::ToString_abi_cxx11_(&local_d0,&local_b0);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_01,&local_150.extension_name,&local_d0);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::RegisterArrowExtension(const ArrowTypeExtension &extension) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	auto extension_info = extension.GetInfo();
	if (arrow_extensions->type_extensions.find(extension_info) != arrow_extensions->type_extensions.end()) {
		throw NotImplementedException("Arrow Extension with configuration %s is already registered",
		                              extension_info.ToString());
	}
	arrow_extensions->type_extensions[extension_info] = extension;
	if (extension.HasType()) {
		const TypeInfo type_info(extension.GetLogicalType());
		arrow_extensions->type_to_info[type_info].push_back(extension_info);
		return;
	}
	const TypeInfo type_info(extension.GetInfo().GetExtensionName());
	arrow_extensions->type_to_info[type_info].push_back(extension_info);
}